

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rapidxml.hpp
# Opt level: O3

xml_node<char> * __thiscall
rapidxml::xml_document<char>::parse_node<0>(xml_document<char> *this,char **text)

{
  char cVar1;
  xml_node<char> *pxVar2;
  char *pcVar3;
  undefined8 *puVar4;
  
  pcVar3 = *text;
  if (*pcVar3 == '!') {
    cVar1 = pcVar3[1];
    if (cVar1 == '-') {
      if (pcVar3[2] == '-') {
        *text = pcVar3 + 3;
        pxVar2 = parse_comment<0>(this,text);
        return pxVar2;
      }
    }
    else if (cVar1 == 'D') {
      if ((((pcVar3[2] == 'O') && (pcVar3[3] == 'C')) && (pcVar3[4] == 'T')) &&
         (((pcVar3[5] == 'Y' && (pcVar3[6] == 'P')) &&
          ((pcVar3[7] == 'E' &&
           (internal::lookup_tables<0>::lookup_whitespace[(byte)pcVar3[8]] != '\0')))))) {
        *text = pcVar3 + 9;
        pxVar2 = parse_doctype<0>(this,text);
        return pxVar2;
      }
    }
    else if (((cVar1 == '[') && (pcVar3[2] == 'C')) &&
            ((pcVar3[3] == 'D' &&
             ((((pcVar3[4] == 'A' && (pcVar3[5] == 'T')) && (pcVar3[6] == 'A')) &&
              (pcVar3[7] == '[')))))) {
      *text = pcVar3 + 8;
      pxVar2 = parse_cdata<0>(this,text);
      return pxVar2;
    }
    pcVar3 = pcVar3 + 1;
    do {
      *text = pcVar3;
      cVar1 = *pcVar3;
      pcVar3 = pcVar3 + 1;
      if (cVar1 == '>') {
        *text = pcVar3;
        return (xml_node<char> *)0x0;
      }
    } while (cVar1 != '\0');
    puVar4 = (undefined8 *)__cxa_allocate_exception(0x18);
    pcVar3 = *text;
    *puVar4 = &PTR__exception_00112ad8;
    puVar4[1] = "unexpected end of data";
    puVar4[2] = pcVar3;
    __cxa_throw(puVar4,&parse_error::typeinfo,std::exception::~exception);
  }
  if (*pcVar3 != '?') {
    pxVar2 = parse_element<0>(this,text);
    return pxVar2;
  }
  *text = pcVar3 + 1;
  if ((((byte)(pcVar3[1] | 0x20U) == 0x78) && ((byte)(pcVar3[2] | 0x20U) == 0x6d)) &&
     (((byte)(pcVar3[3] | 0x20U) == 0x6c &&
      (internal::lookup_tables<0>::lookup_whitespace[(byte)pcVar3[4]] != '\0')))) {
    *text = pcVar3 + 5;
    pxVar2 = parse_xml_declaration<0>(this,text);
    return pxVar2;
  }
  pxVar2 = parse_pi<0>(this,text);
  return pxVar2;
}

Assistant:

xml_node<Ch> *parse_node(Ch *&text)
        {
            // Parse proper node type
            switch (text[0])
            {

            // <...
            default: 
                // Parse and append element node
                return parse_element<Flags>(text);

            // <?...
            case Ch('?'): 
                ++text;     // Skip ?
                if ((text[0] == Ch('x') || text[0] == Ch('X')) &&
                    (text[1] == Ch('m') || text[1] == Ch('M')) && 
                    (text[2] == Ch('l') || text[2] == Ch('L')) &&
                    whitespace_pred::test(text[3]))
                {
                    // '<?xml ' - xml declaration
                    text += 4;      // Skip 'xml '
                    return parse_xml_declaration<Flags>(text);
                }
                else
                {
                    // Parse PI
                    return parse_pi<Flags>(text);
                }
            
            // <!...
            case Ch('!'): 

                // Parse proper subset of <! node
                switch (text[1])    
                {
                
                // <!-
                case Ch('-'):
                    if (text[2] == Ch('-'))
                    {
                        // '<!--' - xml comment
                        text += 3;     // Skip '!--'
                        return parse_comment<Flags>(text);
                    }
                    break;

                // <![
                case Ch('['):
                    if (text[2] == Ch('C') && text[3] == Ch('D') && text[4] == Ch('A') && 
                        text[5] == Ch('T') && text[6] == Ch('A') && text[7] == Ch('['))
                    {
                        // '<![CDATA[' - cdata
                        text += 8;     // Skip '![CDATA['
                        return parse_cdata<Flags>(text);
                    }
                    break;

                // <!D
                case Ch('D'):
                    if (text[2] == Ch('O') && text[3] == Ch('C') && text[4] == Ch('T') && 
                        text[5] == Ch('Y') && text[6] == Ch('P') && text[7] == Ch('E') && 
                        whitespace_pred::test(text[8]))
                    {
                        // '<!DOCTYPE ' - doctype
                        text += 9;      // skip '!DOCTYPE '
                        return parse_doctype<Flags>(text);
                    }

                }   // switch

                // Attempt to skip other, unrecognized node types starting with <!
                ++text;     // Skip !
                while (*text != Ch('>'))
                {
                    if (*text == 0)
                        RAPIDXML_PARSE_ERROR("unexpected end of data", text);
                    ++text;
                }
                ++text;     // Skip '>'
                return 0;   // No node recognized

            }
        }